

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_write.c
# Opt level: O1

int write_s98v1(s98c *ctx,FILE *fp)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  char *__s;
  size_t sVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  char zero [40];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  __s = find_tag_value(ctx,"title");
  uVar2 = 0;
  uVar8 = 0;
  if (__s != (char *)0x0) {
    sVar3 = strlen(__s);
    uVar8 = (int)sVar3 + 1;
    uVar2 = 0x40;
  }
  puVar1 = ctx->p;
  uVar4 = 0x40;
  if (0x40 < (int)uVar8) {
    uVar4 = uVar8;
  }
  iVar7 = (int)ctx->dump_buffer;
  uVar5 = uVar4 + 0x40 + ((int)ctx->loop_start - iVar7);
  if (ctx->loop_start == (uint8_t *)0x0) {
    uVar5 = 0;
  }
  uVar6 = (int)ctx->dump_start - iVar7;
  if (ctx->dump_start == (uint8_t *)0x0) {
    uVar6 = 0;
  }
  (ctx->header).offset_to_tag = uVar2;
  (ctx->header).offset_to_dump = uVar6 + 0x40 + uVar4;
  (ctx->header).offset_to_loop = uVar5;
  fwrite("S98",1,3,(FILE *)fp);
  fputc((ctx->header).version + 0x30,(FILE *)fp);
  local_58._0_4_ = (ctx->header).timer_numerator;
  fwrite(&local_58,1,4,(FILE *)fp);
  local_58._0_4_ = 0;
  fwrite(&local_58,1,4,(FILE *)fp);
  local_58._0_4_ = 0;
  fwrite(&local_58,1,4,(FILE *)fp);
  local_58._0_4_ = 0x40;
  fwrite(&local_58,1,4,(FILE *)fp);
  local_58._0_4_ = (ctx->header).offset_to_dump;
  fwrite(&local_58,1,4,(FILE *)fp);
  local_58 = CONCAT44(local_58._4_4_,(ctx->header).offset_to_loop);
  fwrite(&local_58,1,4,(FILE *)fp);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_38 = 0;
  fwrite(&local_58,1,0x24,(FILE *)fp);
  if (0 < (int)uVar8) {
    fwrite(__s,1,(ulong)uVar8,(FILE *)fp);
  }
  fwrite(&local_58,1,(long)(int)(0x40 - uVar8),(FILE *)fp);
  fwrite(ctx->dump_buffer,1,(long)((int)puVar1 - iVar7),(FILE *)fp);
  return 0;
}

Assistant:

int write_s98v1(struct s98c* ctx, FILE* fp)
{
    int header_size = 0x40; 
    char* title = find_tag_value(ctx, "title");
    int tag_length = (title == NULL) ? 0 : strlen(title) + 1;
    int dump_offset = header_size + tag_length; // where dump bytes *REALLY* starts
    int loop_offset = 0;
    int dump_length = ctx->p - ctx->dump_buffer;

    if(dump_offset < 0x80) dump_offset = 0x80;
    if(ctx->loop_start != NULL) {
        loop_offset = dump_offset + (ctx->loop_start - ctx->dump_buffer);
    }
    if(ctx->dump_start != NULL) {
        dump_offset += (ctx->dump_start - ctx->dump_buffer);
    }
    ctx->header.offset_to_tag = (title == NULL) ? 0 : 0x40;
    ctx->header.offset_to_dump = dump_offset;
    ctx->header.offset_to_loop = loop_offset;

    fwrite("S98", 1, 3, fp); // 0
    fputc('0' + ctx->header.version, fp); // 3
    write_dword(fp, ctx->header.timer_numerator); // 4
    write_dword(fp, 0); // 8
    write_dword(fp, 0); // c
    write_dword(fp, 0x40); // 10 
    write_dword(fp, ctx->header.offset_to_dump); //14
    write_dword(fp, ctx->header.offset_to_loop); //18

    char zero[40];
    memset(zero, 0, sizeof zero);
    fwrite(zero, 1, 36, fp);

    if(tag_length > 0) {
        fwrite(title, 1, tag_length, fp);
    }
        
    fwrite(zero, 1, 0x40 - tag_length, fp);

    fwrite(ctx->dump_buffer, 1, dump_length, fp);

    return 0;
}